

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void check_pragma(c2m_ctx_t c2m_ctx,token_t t,VARR_token_t *tokens)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  token_t *pptVar8;
  size_t sVar9;
  ulong uVar10;
  size_t tokens_len;
  size_t i;
  token_t *tokens_arr;
  VARR_token_t *tokens_local;
  token_t t_local;
  c2m_ctx_t c2m_ctx_local;
  
  pptVar8 = VARR_token_taddr(tokens);
  sVar9 = VARR_token_tlength(tokens);
  tokens_len = 0;
  if ((sVar9 != 0) && ((short)*(undefined4 *)*pptVar8 == 0x20)) {
    tokens_len = 1;
  }
  if (((sVar9 <= tokens_len) || ((short)*(undefined4 *)pptVar8[tokens_len] != 0x103)) ||
     (iVar7 = strcmp(pptVar8[tokens_len]->repr,"STDC"), iVar7 != 0)) {
    uVar1._0_4_ = (t->pos).lno;
    uVar1._4_4_ = (t->pos).ln_pos;
    warning(c2m_ctx,0x1d7dd9,(t->pos).fname,uVar1);
    return;
  }
  uVar10 = tokens_len + 1;
  if ((uVar10 < sVar9) && ((short)*(undefined4 *)pptVar8[uVar10] == 0x20)) {
    uVar10 = tokens_len + 2;
  }
  tokens_len = uVar10;
  if ((sVar9 <= tokens_len) || ((short)*(undefined4 *)pptVar8[tokens_len] != 0x103)) {
    uVar2._0_4_ = (t->pos).lno;
    uVar2._4_4_ = (t->pos).ln_pos;
    error(c2m_ctx,0x1d7de8,(t->pos).fname,uVar2);
    return;
  }
  iVar7 = strcmp(pptVar8[tokens_len]->repr,"FP_CONTRACT");
  if (((iVar7 != 0) && (iVar7 = strcmp(pptVar8[tokens_len]->repr,"FENV_ACCESS"), iVar7 != 0)) &&
     (iVar7 = strcmp(pptVar8[tokens_len]->repr,"CX_LIMITED_RANGE"), iVar7 != 0)) {
    uVar3._0_4_ = (t->pos).lno;
    uVar3._4_4_ = (t->pos).ln_pos;
    error(c2m_ctx,0x1d7e23,(t->pos).fname,uVar3,pptVar8[tokens_len]->repr);
    return;
  }
  uVar10 = tokens_len + 1;
  if ((uVar10 < sVar9) && ((short)*(undefined4 *)pptVar8[uVar10] == 0x20)) {
    uVar10 = tokens_len + 2;
  }
  tokens_len = uVar10;
  if ((sVar9 <= tokens_len) || ((short)*(undefined4 *)pptVar8[tokens_len] != 0x103)) {
    uVar4._0_4_ = (t->pos).lno;
    uVar4._4_4_ = (t->pos).ln_pos;
    error(c2m_ctx,0x1d7e3a,(t->pos).fname,uVar4);
    return;
  }
  iVar7 = strcmp(pptVar8[tokens_len]->repr,"ON");
  if (((iVar7 != 0) && (iVar7 = strcmp(pptVar8[tokens_len]->repr,"OFF"), iVar7 != 0)) &&
     (iVar7 = strcmp(pptVar8[tokens_len]->repr,"DEFAULT"), iVar7 != 0)) {
    uVar5._0_4_ = (t->pos).lno;
    uVar5._4_4_ = (t->pos).ln_pos;
    error(c2m_ctx,0x1d7e56,(t->pos).fname,uVar5,pptVar8[tokens_len]->repr);
    return;
  }
  uVar10 = tokens_len + 1;
  if ((uVar10 < sVar9) &&
     (((short)*(undefined4 *)pptVar8[uVar10] == 0x20 ||
      ((short)*(undefined4 *)pptVar8[uVar10] == 10)))) {
    uVar10 = tokens_len + 2;
  }
  tokens_len = uVar10;
  if (sVar9 <= tokens_len) {
    return;
  }
  uVar6._0_4_ = (t->pos).lno;
  uVar6._4_4_ = (t->pos).ln_pos;
  error(c2m_ctx,0x1d7e70,(t->pos).fname,uVar6);
  return;
}

Assistant:

static void check_pragma (c2m_ctx_t c2m_ctx, token_t t, VARR (token_t) * tokens) {
  token_t *tokens_arr = VARR_ADDR (token_t, tokens);
  size_t i, tokens_len = VARR_LENGTH (token_t, tokens);

  i = 0;
  if (i < tokens_len && tokens_arr[i]->code == ' ') i++;
#ifdef _WIN32
  if (i + 1 == tokens_len && tokens_arr[i]->code == T_ID
      && strcmp (tokens_arr[i]->repr, "once") == 0) {
    pre_ctx_t pre_ctx = c2m_ctx->pre_ctx;
    VARR_PUSH (char_ptr_t, once_include_files, cs->fname);
    return;
  }
#endif
  if (i >= tokens_len || tokens_arr[i]->code != T_ID || strcmp (tokens_arr[i]->repr, "STDC") != 0) {
    warning (c2m_ctx, t->pos, "unknown pragma");
    return;
  }
  i++;
  if (i < tokens_len && tokens_arr[i]->code == ' ') i++;
  if (i >= tokens_len || tokens_arr[i]->code != T_ID) {
    error (c2m_ctx, t->pos, "wrong STDC pragma");
    return;
  }
  if (strcmp (tokens_arr[i]->repr, "FP_CONTRACT") != 0
      && strcmp (tokens_arr[i]->repr, "FENV_ACCESS") != 0
      && strcmp (tokens_arr[i]->repr, "CX_LIMITED_RANGE") != 0) {
    error (c2m_ctx, t->pos, "unknown STDC pragma %s", tokens_arr[i]->repr);
    return;
  }
  i++;
  if (i < tokens_len && tokens_arr[i]->code == ' ') i++;
  if (i >= tokens_len || tokens_arr[i]->code != T_ID) {
    error (c2m_ctx, t->pos, "wrong STDC pragma value");
    return;
  }
  if (strcmp (tokens_arr[i]->repr, "ON") != 0 && strcmp (tokens_arr[i]->repr, "OFF") != 0
      && strcmp (tokens_arr[i]->repr, "DEFAULT") != 0) {
    error (c2m_ctx, t->pos, "unknown STDC pragma value", tokens_arr[i]->repr);
    return;
  }
  i++;
  if (i < tokens_len && (tokens_arr[i]->code == ' ' || tokens_arr[i]->code == '\n')) i++;
  if (i < tokens_len) error (c2m_ctx, t->pos, "garbage at STDC pragma end");
}